

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS
ref_migrate_split_dir(REF_MPI ref_mpi,REF_INT n,REF_DBL *xyz,REF_DBL *transform,REF_INT *dir)

{
  uint uVar1;
  REF_DBL local_c8;
  REF_DBL local_c0;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT j;
  REF_INT i;
  REF_DBL transformed [3];
  REF_DBL temp;
  REF_DBL maxes [3];
  double local_58;
  REF_DBL mins [3];
  REF_INT *dir_local;
  REF_DBL *transform_local;
  REF_DBL *xyz_local;
  REF_INT n_local;
  REF_MPI ref_mpi_local;
  
  *dir = 0;
  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
    mins[(long)ref_private_macro_code_rss_1 + -1] = 1e+200;
    maxes[(long)ref_private_macro_code_rss_1 + -1] = -1e+200;
  }
  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < n;
      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
    uVar1 = ref_matrix_ax(3,transform,xyz + ref_private_macro_code_rss * 3,(REF_DBL *)&j);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x162,"ref_migrate_split_dir",(ulong)uVar1,"ax");
      return uVar1;
    }
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      if (*(double *)(&j + (long)ref_private_macro_code_rss_1 * 2) <=
          mins[(long)ref_private_macro_code_rss_1 + -1]) {
        local_c0 = *(REF_DBL *)(&j + (long)ref_private_macro_code_rss_1 * 2);
      }
      else {
        local_c0 = mins[(long)ref_private_macro_code_rss_1 + -1];
      }
      mins[(long)ref_private_macro_code_rss_1 + -1] = local_c0;
      if (maxes[(long)ref_private_macro_code_rss_1 + -1] <
          *(double *)(&j + (long)ref_private_macro_code_rss_1 * 2) ||
          maxes[(long)ref_private_macro_code_rss_1 + -1] ==
          *(double *)(&j + (long)ref_private_macro_code_rss_1 * 2)) {
        local_c8 = *(REF_DBL *)(&j + (long)ref_private_macro_code_rss_1 * 2);
      }
      else {
        local_c8 = maxes[(long)ref_private_macro_code_rss_1 + -1];
      }
      maxes[(long)ref_private_macro_code_rss_1 + -1] = local_c8;
    }
  }
  ref_private_macro_code_rss_1 = 0;
  while( true ) {
    if (2 < ref_private_macro_code_rss_1) {
      if ((temp - local_58 <= maxes[0] - mins[0]) && (maxes[1] - mins[1] <= maxes[0] - mins[0])) {
        *dir = 1;
      }
      if ((temp - local_58 <= maxes[1] - mins[1]) && (maxes[0] - mins[0] <= maxes[1] - mins[1])) {
        *dir = 2;
      }
      return 0;
    }
    transformed[2] = mins[(long)ref_private_macro_code_rss_1 + -1];
    uVar1 = ref_mpi_min(ref_mpi,transformed + 2,mins + (long)ref_private_macro_code_rss_1 + -1,3);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x16a,"ref_migrate_split_dir",(ulong)uVar1,"min");
      return uVar1;
    }
    uVar1 = ref_mpi_bcast(ref_mpi,mins + (long)ref_private_macro_code_rss_1 + -1,1,3);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x16b,"ref_migrate_split_dir",(ulong)uVar1,"bcast");
      return uVar1;
    }
    transformed[2] = maxes[(long)ref_private_macro_code_rss_1 + -1];
    uVar1 = ref_mpi_max(ref_mpi,transformed + 2,maxes + (long)ref_private_macro_code_rss_1 + -1,3);
    if (uVar1 != 0) break;
    uVar1 = ref_mpi_bcast(ref_mpi,maxes + (long)ref_private_macro_code_rss_1 + -1,1,3);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x16e,"ref_migrate_split_dir",(ulong)uVar1,"bcast");
      return uVar1;
    }
    ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x16d,
         "ref_migrate_split_dir",(ulong)uVar1,"max");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_split_dir(REF_MPI ref_mpi, REF_INT n,
                                         REF_DBL *xyz, REF_DBL *transform,
                                         REF_INT *dir) {
  REF_DBL mins[3], maxes[3], temp, transformed[3];
  REF_INT i, j;
  *dir = 0;
  for (j = 0; j < 3; j++) {
    mins[j] = REF_DBL_MAX;
    maxes[j] = REF_DBL_MIN;
  }
  for (i = 0; i < n; i++) {
    RSS(ref_matrix_ax(3, transform, &(xyz[3 * i]), transformed), "ax");
    for (j = 0; j < 3; j++) {
      mins[j] = MIN(mins[j], transformed[j]);
      maxes[j] = MAX(maxes[j], transformed[j]);
    }
  }
  for (j = 0; j < 3; j++) {
    temp = mins[j];
    RSS(ref_mpi_min(ref_mpi, &temp, &(mins[j]), REF_DBL_TYPE), "min");
    RSS(ref_mpi_bcast(ref_mpi, &(mins[j]), 1, REF_DBL_TYPE), "bcast");
    temp = maxes[j];
    RSS(ref_mpi_max(ref_mpi, &temp, &(maxes[j]), REF_DBL_TYPE), "max");
    RSS(ref_mpi_bcast(ref_mpi, &(maxes[j]), 1, REF_DBL_TYPE), "bcast");
  }
  if ((maxes[1] - mins[1]) >= (maxes[0] - mins[0]) &&
      (maxes[1] - mins[1]) >= (maxes[2] - mins[2]))
    *dir = 1;
  if ((maxes[2] - mins[2]) >= (maxes[0] - mins[0]) &&
      (maxes[2] - mins[2]) >= (maxes[1] - mins[1]))
    *dir = 2;

  return REF_SUCCESS;
}